

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

MessagePattern * __thiscall
icu_63::MessagePattern::operator=(MessagePattern *this,MessagePattern *other)

{
  UBool UVar1;
  UErrorCode local_24;
  MessagePattern *pMStack_20;
  UErrorCode errorCode;
  MessagePattern *other_local;
  MessagePattern *this_local;
  
  if (this != other) {
    this->aposMode = other->aposMode;
    pMStack_20 = other;
    other_local = this;
    UnicodeString::operator=(&this->msg,&other->msg);
    this->hasArgNames = pMStack_20->hasArgNames;
    this->hasArgNumbers = pMStack_20->hasArgNumbers;
    this->needsAutoQuoting = pMStack_20->needsAutoQuoting;
    local_24 = U_ZERO_ERROR;
    UVar1 = copyStorage(this,pMStack_20,&local_24);
    if (UVar1 == '\0') {
      clear(this);
    }
  }
  return this;
}

Assistant:

MessagePattern &
MessagePattern::operator=(const MessagePattern &other) {
    if(this==&other) {
        return *this;
    }
    aposMode=other.aposMode;
    msg=other.msg;
    hasArgNames=other.hasArgNames;
    hasArgNumbers=other.hasArgNumbers;
    needsAutoQuoting=other.needsAutoQuoting;
    UErrorCode errorCode=U_ZERO_ERROR;
    if(!copyStorage(other, errorCode)) {
        clear();
    }
    return *this;
}